

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O1

int uv_fs_event_start(uv_fs_event_t *handle,uv_fs_event_cb cb,char *path,uint flags)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  uv_loop_t *loop;
  int iVar4;
  size_t sVar5;
  long *plVar6;
  int *piVar7;
  void **ppvVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  long *plVar13;
  long *plVar14;
  void **ppvVar15;
  
  iVar4 = -0x16;
  if ((handle->flags & 4) == 0) {
    loop = handle->loop;
    iVar4 = 0;
    if (loop->inotify_fd == -1) {
      iVar4 = inotify_init1(0x80800);
      if (iVar4 < 0) {
        piVar7 = __errno_location();
        iVar4 = -*piVar7;
      }
      else {
        loop->inotify_fd = iVar4;
        uv__io_init(&loop->inotify_read_watcher,uv__inotify_read,iVar4);
        uv__io_start(loop,&loop->inotify_read_watcher,1);
        iVar4 = 0;
      }
    }
    if (iVar4 == 0) {
      iVar4 = inotify_add_watch(handle->loop->inotify_fd,path,0xfc6);
      if (iVar4 == -1) {
        piVar7 = __errno_location();
        iVar4 = -*piVar7;
      }
      else {
        for (plVar6 = (long *)handle->loop->inotify_watchers; plVar6 != (long *)0x0;
            plVar6 = (long *)*plVar6) {
          if ((int)plVar6[8] <= iVar4) {
            if (iVar4 <= (int)plVar6[8]) goto LAB_0010fb62;
            plVar6 = plVar6 + 1;
          }
        }
        plVar6 = (long *)0x0;
LAB_0010fb62:
        if (plVar6 == (long *)0x0) {
          sVar5 = strlen(path);
          plVar6 = (long *)uv__malloc(sVar5 + 0x49);
          if (plVar6 == (long *)0x0) {
            return -0xc;
          }
          *(int *)(plVar6 + 8) = iVar4;
          memcpy(plVar6 + 9,path,sVar5 + 1);
          plVar6[7] = (long)(plVar6 + 9);
          plVar6[4] = (long)(plVar6 + 4);
          plVar6[5] = (long)(plVar6 + 4);
          *(undefined4 *)(plVar6 + 6) = 0;
          plVar13 = (long *)handle->loop->inotify_watchers;
          if (plVar13 == (long *)0x0) {
            lVar12 = 8;
            plVar9 = (long *)0x0;
          }
          else {
            do {
              plVar9 = plVar13;
              iVar2 = (int)plVar9[8];
              plVar11 = plVar9;
              if (iVar2 <= iVar4) {
                if (iVar4 <= iVar2) goto LAB_0010fdf9;
                plVar11 = plVar9 + 1;
              }
              plVar13 = (long *)*plVar11;
            } while ((long *)*plVar11 != (long *)0x0);
            lVar12 = (ulong)(iVar2 <= iVar4) << 3;
          }
          ppvVar8 = &handle->loop->inotify_watchers;
          plVar6[2] = (long)plVar9;
          *plVar6 = 0;
          plVar6[1] = 0;
          *(undefined4 *)(plVar6 + 3) = 1;
          if (plVar9 == (long *)0x0) {
            *ppvVar8 = plVar6;
          }
          else {
            *(long **)((long)plVar9 + lVar12) = plVar6;
            plVar13 = plVar6;
            do {
              if ((int)plVar9[3] != 1) break;
              plVar11 = (long *)plVar9[2];
              plVar14 = (long *)*plVar11;
              plVar10 = plVar13;
              if (plVar9 == plVar14) {
                plVar14 = (long *)plVar11[1];
                if ((plVar14 != (long *)0x0) && ((int)plVar14[3] == 1)) goto LAB_0010fc8e;
                plVar14 = (long *)plVar9[1];
                if (plVar14 == plVar13) {
                  lVar12 = *plVar14;
                  plVar9[1] = lVar12;
                  if (lVar12 != 0) {
                    *(long **)(lVar12 + 0x10) = plVar9;
                  }
                  lVar12 = plVar9[2];
                  plVar14[2] = lVar12;
                  ppvVar15 = ppvVar8;
                  if (lVar12 != 0) {
                    ppvVar15 = (void **)((undefined8 *)plVar9[2] + (plVar9 != *(long **)plVar9[2]));
                  }
                  *ppvVar15 = plVar14;
                  *plVar14 = (long)plVar9;
                  plVar9[2] = (long)plVar14;
                  plVar10 = plVar9;
                  plVar9 = plVar13;
                }
                *(undefined4 *)(plVar9 + 3) = 0;
                *(undefined4 *)(plVar11 + 3) = 1;
                plVar13 = (long *)*plVar11;
                lVar12 = plVar13[1];
                *plVar11 = lVar12;
                if (lVar12 != 0) {
                  *(long **)(lVar12 + 0x10) = plVar11;
                }
                lVar12 = plVar11[2];
                plVar13[2] = lVar12;
                ppvVar15 = ppvVar8;
                if (lVar12 != 0) {
                  ppvVar15 = (void **)((undefined8 *)plVar11[2] + (plVar11 != *(long **)plVar11[2]))
                  ;
                }
                *ppvVar15 = plVar13;
                plVar13[1] = (long)plVar11;
LAB_0010fdd6:
                plVar11[2] = (long)plVar13;
                plVar11 = plVar10;
              }
              else {
                if ((plVar14 == (long *)0x0) || ((int)plVar14[3] != 1)) {
                  plVar14 = (long *)*plVar9;
                  if (plVar14 == plVar13) {
                    lVar12 = plVar14[1];
                    *plVar9 = lVar12;
                    if (lVar12 != 0) {
                      *(long **)(lVar12 + 0x10) = plVar9;
                    }
                    lVar12 = plVar9[2];
                    plVar14[2] = lVar12;
                    ppvVar15 = ppvVar8;
                    if (lVar12 != 0) {
                      ppvVar15 = (void **)((undefined8 *)plVar9[2] + (plVar9 != *(long **)plVar9[2])
                                          );
                    }
                    *ppvVar15 = plVar14;
                    plVar14[1] = (long)plVar9;
                    plVar9[2] = (long)plVar14;
                    plVar10 = plVar9;
                    plVar9 = plVar13;
                  }
                  *(undefined4 *)(plVar9 + 3) = 0;
                  *(undefined4 *)(plVar11 + 3) = 1;
                  plVar13 = (long *)plVar11[1];
                  lVar12 = *plVar13;
                  plVar11[1] = lVar12;
                  if (lVar12 != 0) {
                    *(long **)(lVar12 + 0x10) = plVar11;
                  }
                  lVar12 = plVar11[2];
                  plVar13[2] = lVar12;
                  ppvVar15 = ppvVar8;
                  if (lVar12 != 0) {
                    ppvVar15 = (void **)((undefined8 *)plVar11[2] +
                                        (plVar11 != *(long **)plVar11[2]));
                  }
                  *ppvVar15 = plVar13;
                  *plVar13 = (long)plVar11;
                  goto LAB_0010fdd6;
                }
LAB_0010fc8e:
                *(undefined4 *)(plVar14 + 3) = 0;
                *(undefined4 *)(plVar9 + 3) = 0;
                *(undefined4 *)(plVar11 + 3) = 1;
              }
              plVar9 = (long *)plVar11[2];
              plVar13 = plVar11;
            } while (plVar9 != (long *)0x0);
          }
          *(undefined4 *)((long)*ppvVar8 + 0x18) = 0;
        }
LAB_0010fdf9:
        uVar3 = handle->flags;
        if (((uVar3 & 4) == 0) && (handle->flags = uVar3 | 4, (uVar3 & 8) != 0)) {
          puVar1 = &handle->loop->active_handles;
          *puVar1 = *puVar1 + 1;
        }
        handle->watchers[0] = plVar6 + 4;
        plVar13 = (long *)plVar6[5];
        handle->watchers[1] = plVar13;
        *plVar13 = (long)handle->watchers;
        plVar6[5] = (long)handle->watchers;
        handle->path = (char *)plVar6[7];
        handle->cb = cb;
        handle->wd = iVar4;
        iVar4 = 0;
      }
    }
  }
  return iVar4;
}

Assistant:

int uv_fs_event_start(uv_fs_event_t* handle,
                      uv_fs_event_cb cb,
                      const char* path,
                      unsigned int flags) {
  struct watcher_list* w;
  size_t len;
  int events;
  int err;
  int wd;

  if (uv__is_active(handle))
    return UV_EINVAL;

  err = init_inotify(handle->loop);
  if (err)
    return err;

  events = IN_ATTRIB
         | IN_CREATE
         | IN_MODIFY
         | IN_DELETE
         | IN_DELETE_SELF
         | IN_MOVE_SELF
         | IN_MOVED_FROM
         | IN_MOVED_TO;

  wd = inotify_add_watch(handle->loop->inotify_fd, path, events);
  if (wd == -1)
    return UV__ERR(errno);

  w = find_watcher(handle->loop, wd);
  if (w)
    goto no_insert;

  len = strlen(path) + 1;
  w = uv__malloc(sizeof(*w) + len);
  if (w == NULL)
    return UV_ENOMEM;

  w->wd = wd;
  w->path = memcpy(w + 1, path, len);
  QUEUE_INIT(&w->watchers);
  w->iterating = 0;
  RB_INSERT(watcher_root, CAST(&handle->loop->inotify_watchers), w);

no_insert:
  uv__handle_start(handle);
  QUEUE_INSERT_TAIL(&w->watchers, &handle->watchers);
  handle->path = w->path;
  handle->cb = cb;
  handle->wd = wd;

  return 0;
}